

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::DisconnectNode(CConnman *this,string *strNode)

{
  long lVar1;
  undefined1 uVar2;
  CNode *pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  CNode *pnode;
  Level in_stack_000000a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000b0;
  long *in_stack_000000b8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock93;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  CConnman *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff30;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff38;
  allocator<char> *__a;
  undefined7 in_stack_ffffffffffffff40;
  char *flag;
  int in_stack_ffffffffffffff6c;
  bool local_69;
  allocator<char> local_59;
  ConstevalFormatString<2U> in_stack_ffffffffffffffa8;
  string_view in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             (char *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             (char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
             SUB41((uint)in_stack_ffffffffffffff18 >> 0x18,0));
  pCVar3 = FindNode(in_stack_ffffffffffffff20,
                    (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (pCVar3 == (CNode *)0x0) {
    local_69 = false;
  }
  else {
    uVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),Trace)
    ;
    if ((bool)uVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff10);
      flag = "disconnect by address%s matched peer=%d; disconnecting\n";
      bVar4 = (fLogIPs & 1U) == 0;
      if (bVar4) {
        __a = &local_59;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_RDI,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff40),__a);
      }
      else {
        tinyformat::format<std::__cxx11::string>
                  ((char *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff20);
      }
      CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_fffffffffffffef8 = 1;
      LogPrintFormatInternal<std::__cxx11::string,long>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffff6c,
                 (LogFlags)flag,in_stack_000000a0,in_stack_ffffffffffffffa8,in_stack_000000b0,
                 in_stack_000000b8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (bVar4) {
        std::allocator<char>::~allocator(&local_59);
      }
    }
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),false);
    local_69 = true;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_69;
}

Assistant:

bool CConnman::DisconnectNode(const std::string& strNode)
{
    LOCK(m_nodes_mutex);
    if (CNode* pnode = FindNode(strNode)) {
        LogDebug(BCLog::NET, "disconnect by address%s matched peer=%d; disconnecting\n", (fLogIPs ? strprintf("=%s", strNode) : ""), pnode->GetId());
        pnode->fDisconnect = true;
        return true;
    }
    return false;
}